

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O2

GLFWbool waitForAnyEvent(double *timeout)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  nfds_t nStack_50;
  pollfd fds [3];
  
  fds[0].fd = *(int *)(_glfw.x11.display + 0x10);
  fds[0].events = 1;
  fds[0].revents = 0;
  fds[1].fd = _glfw.x11.emptyEventPipe[0];
  fds[2].fd = 0;
  fds[2].events = 0;
  fds[2].revents = 0;
  if (_glfw.linjs.inotify < 1) {
    nStack_50 = 2;
  }
  else {
    fds[2].events = 1;
    fds[2].revents = 0;
    fds[2].fd = _glfw.linjs.inotify;
    nStack_50 = 3;
  }
  fds[1]._4_4_ = fds[0]._4_4_;
  while (uVar3 = XPending(_glfw.x11.display), (int)uVar3 == 0) {
    uVar2 = waitForData(fds,nStack_50,timeout);
    uVar3 = (ulong)uVar2;
    if (uVar2 == 0) break;
    uVar3 = 0;
    while (nStack_50 - 1 != uVar3) {
      lVar1 = uVar3 + 1;
      uVar3 = uVar3 + 1;
      if ((fds[lVar1].revents & 1) != 0) goto LAB_0021ba1d;
    }
  }
LAB_0021ba1d:
  return (GLFWbool)uVar3;
}

Assistant:

static GLFWbool waitForAnyEvent(double* timeout)
{
    nfds_t count = 2;
    struct pollfd fds[3] =
    {
        { ConnectionNumber(_glfw.x11.display), POLLIN },
        { _glfw.x11.emptyEventPipe[0], POLLIN }
    };

#if defined(__linux__)
    if (_glfw.linjs.inotify > 0)
        fds[count++] = (struct pollfd) { _glfw.linjs.inotify, POLLIN };
#endif

    while (!XPending(_glfw.x11.display))
    {
        if (!waitForData(fds, count, timeout))
            return GLFW_FALSE;

        for (int i = 1; i < count; i++)
        {
            if (fds[i].revents & POLLIN)
                return GLFW_TRUE;
        }
    }

    return GLFW_TRUE;
}